

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::descriptor_set_layout_is_supported
          (Impl *this,VkDescriptorSetLayoutCreateInfo *info)

{
  VkDescriptorType VVar1;
  uint uVar2;
  size_type sVar3;
  VkDescriptorSetLayoutBindingFlagsCreateInfo *pVVar4;
  VkMutableDescriptorTypeCreateInfoEXT *pVVar5;
  bool bVar6;
  allocator local_121;
  key_type local_120;
  uint local_fc;
  VkMutableDescriptorTypeListEXT *pVStack_f8;
  uint32_t j;
  VkMutableDescriptorTypeListEXT *list;
  int local_e8;
  DescriptorCounts mutable_counts;
  uint32_t *count;
  uint uStack_b8;
  bool binding_is_update_after_bind;
  VkDescriptorBindingFlags supported_binding_flags;
  uint i;
  bool pool_is_update_after_bind;
  VkMutableDescriptorTypeCreateInfoEXT *mutable_info;
  VkDescriptorSetLayoutBindingFlagsCreateInfo *flags;
  uint local_98;
  uint32_t total_count;
  DescriptorCounts counts;
  allocator local_49;
  key_type local_48;
  undefined4 local_28;
  byte local_21;
  VkDescriptorSetLayoutCreateFlags supported_flags;
  bool must_check_set_layout_before_accept;
  VkDescriptorSetLayoutCreateInfo *info_local;
  Impl *this_local;
  
  local_21 = 0;
  local_28 = 0xf3;
  if ((info->flags & 0xffffff0c) == 0) {
    if ((this->null_device & 1U) == 0) {
      _supported_flags = info;
      info_local = (VkDescriptorSetLayoutCreateInfo *)this;
      if ((info->flags & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_48,"VK_KHR_push_descriptor",&local_49);
        sVar3 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->enabled_extensions,&local_48);
        bVar6 = false;
        if (sVar3 == 0) {
          bVar6 = (this->features).vk14.pushDescriptor == 0;
        }
        std::__cxx11::string::~string((string *)&local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        if (bVar6) {
          return false;
        }
      }
      if ((_supported_flags->flags & 2) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&counts.acceleration_structure,"VK_EXT_descriptor_indexing",
                   (allocator *)((long)&counts.ssbo_dynamic + 3));
        sVar3 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->enabled_extensions,(key_type *)&counts.acceleration_structure);
        bVar6 = false;
        if (sVar3 == 0) {
          bVar6 = (this->features).vk12.descriptorIndexing == 0;
        }
        std::__cxx11::string::~string((string *)&counts.acceleration_structure);
        std::allocator<char>::~allocator((allocator<char> *)((long)&counts.ssbo_dynamic + 3));
        if (bVar6) {
          return false;
        }
      }
      if ((_supported_flags->flags & 0x30) != 0) {
        if ((this->features).descriptor_buffer.descriptorBuffer == 0) {
          return false;
        }
        if (((_supported_flags->flags & 1) != 0) &&
           ((this->features).descriptor_buffer.descriptorBufferPushDescriptors == 0)) {
          return false;
        }
      }
      if (((_supported_flags->flags & 0x80) == 0) ||
         ((this->features).device_generated_commands_compute_nv.deviceGeneratedCompute != 0)) {
        if (((_supported_flags->flags & 0x40) == 0) ||
           ((this->features).per_stage_descriptor_set_nv.perStageDescriptorSet != 0)) {
          memset(&local_98,0,0x24);
          flags._4_4_ = 0;
          pVVar4 = find_pnext<VkDescriptorSetLayoutBindingFlagsCreateInfo>
                             (VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO,
                              _supported_flags->pNext);
          pVVar5 = find_pnext<VkMutableDescriptorTypeCreateInfoEXT>
                             (VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT,
                              _supported_flags->pNext);
          uVar2 = _supported_flags->flags;
          for (uStack_b8 = 0; uStack_b8 < _supported_flags->bindingCount; uStack_b8 = uStack_b8 + 1)
          {
            bVar6 = shader_stage_mask_is_supported
                              (this,_supported_flags->pBindings[uStack_b8].stageFlags);
            if (!bVar6) {
              return false;
            }
            if ((pVVar4 != (VkDescriptorSetLayoutBindingFlagsCreateInfo *)0x0) &&
               ((pVVar4->pBindingFlags[uStack_b8] & 0xfffffff0) != 0)) {
              return false;
            }
            bVar6 = false;
            if ((pVVar4 != (VkDescriptorSetLayoutBindingFlagsCreateInfo *)0x0) &&
               (bVar6 = false, uStack_b8 < pVVar4->bindingCount)) {
              bVar6 = (pVVar4->pBindingFlags[uStack_b8] & 1) != 0;
            }
            mutable_counts.ssbo_dynamic = 0;
            mutable_counts.acceleration_structure = 0;
            VVar1 = _supported_flags->pBindings[uStack_b8].descriptorType;
            if (VVar1 == VK_DESCRIPTOR_TYPE_SAMPLER) {
              if ((bVar6) &&
                 ((this->features).descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind
                  == 0)) {
                return false;
              }
              mutable_counts._28_8_ = &counts.ubo;
            }
            else if (VVar1 - VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER < 2) {
              if ((bVar6) &&
                 ((this->features).descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind
                  == 0)) {
                return false;
              }
              mutable_counts._28_8_ = &local_98;
            }
            else if (VVar1 == VK_DESCRIPTOR_TYPE_STORAGE_IMAGE) {
              if ((bVar6) &&
                 ((this->features).descriptor_indexing.descriptorBindingStorageImageUpdateAfterBind
                  == 0)) {
                return false;
              }
              mutable_counts._28_8_ = &total_count;
            }
            else if (VVar1 == VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER) {
              if ((bVar6) &&
                 ((this->features).descriptor_indexing.
                  descriptorBindingUniformTexelBufferUpdateAfterBind == 0)) {
                return false;
              }
              mutable_counts._28_8_ = &local_98;
            }
            else if (VVar1 == VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER) {
              if ((bVar6) &&
                 ((this->features).descriptor_indexing.
                  descriptorBindingStorageTexelBufferUpdateAfterBind == 0)) {
                return false;
              }
              mutable_counts._28_8_ = &total_count;
            }
            else if (VVar1 == VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER) {
              if ((bVar6) &&
                 ((this->features).descriptor_indexing.descriptorBindingUniformBufferUpdateAfterBind
                  == 0)) {
                return false;
              }
              mutable_counts._28_8_ = &counts.storage_image;
            }
            else if (VVar1 == VK_DESCRIPTOR_TYPE_STORAGE_BUFFER) {
              if ((bVar6) &&
                 ((this->features).descriptor_indexing.descriptorBindingStorageBufferUpdateAfterBind
                  == 0)) {
                return false;
              }
              mutable_counts._28_8_ = &counts;
            }
            else if (VVar1 == VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC) {
              if (bVar6) {
                return false;
              }
              mutable_counts._28_8_ = &counts.input_attachment;
            }
            else if (VVar1 == VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC) {
              if (bVar6) {
                return false;
              }
              mutable_counts._28_8_ = &counts.sampler;
            }
            else if (VVar1 == VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT) {
              if (bVar6) {
                return false;
              }
              mutable_counts._28_8_ = &counts.ssbo;
            }
            else if (VVar1 == VK_DESCRIPTOR_TYPE_INLINE_UNIFORM_BLOCK) {
              if ((this->features).inline_uniform_block.inlineUniformBlock == 0) {
                return false;
              }
              if ((this->props).inline_uniform_block.maxInlineUniformBlockSize <
                  _supported_flags->pBindings[uStack_b8].descriptorCount) {
                return false;
              }
              if ((bVar6) &&
                 ((this->features).inline_uniform_block.
                  descriptorBindingInlineUniformBlockUpdateAfterBind == 0)) {
                return false;
              }
            }
            else if (VVar1 == VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR) {
              if ((bVar6) &&
                 ((this->features).acceleration_structure.
                  descriptorBindingAccelerationStructureUpdateAfterBind == 0)) {
                return false;
              }
              if ((this->features).acceleration_structure.accelerationStructure == 0) {
                return false;
              }
              mutable_counts._28_8_ = &counts.ubo_dynamic;
            }
            else if (VVar1 == VK_DESCRIPTOR_TYPE_MUTABLE_EXT) {
              memset((void *)((long)&list + 4),0,0x24);
              if ((this->features).mutable_descriptor_type.mutableDescriptorType == 0) {
                return false;
              }
              if ((pVVar5 == (VkMutableDescriptorTypeCreateInfoEXT *)0x0) ||
                 (pVVar5->mutableDescriptorTypeListCount <= uStack_b8)) {
                return false;
              }
              pVStack_f8 = pVVar5->pMutableDescriptorTypeLists + uStack_b8;
              for (local_fc = 0; local_fc < pVStack_f8->descriptorTypeCount; local_fc = local_fc + 1
                  ) {
                switch(pVStack_f8->pDescriptorTypes[local_fc]) {
                case VK_DESCRIPTOR_TYPE_SAMPLER:
                  list._4_4_ = 1;
                  local_21 = 1;
                  break;
                default:
                  return false;
                case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
                  if ((bVar6) &&
                     ((this->features).descriptor_indexing.
                      descriptorBindingSampledImageUpdateAfterBind == 0)) {
                    return false;
                  }
                  list._4_4_ = 1;
                  break;
                case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
                  if ((bVar6) &&
                     ((this->features).descriptor_indexing.
                      descriptorBindingStorageImageUpdateAfterBind == 0)) {
                    return false;
                  }
                  local_e8 = 1;
                  break;
                case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
                  if ((bVar6) &&
                     ((this->features).descriptor_indexing.
                      descriptorBindingUniformTexelBufferUpdateAfterBind == 0)) {
                    return false;
                  }
                  list._4_4_ = 1;
                  break;
                case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
                  if ((bVar6) &&
                     ((this->features).descriptor_indexing.
                      descriptorBindingStorageTexelBufferUpdateAfterBind == 0)) {
                    return false;
                  }
                  local_e8 = 1;
                  break;
                case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
                  if ((bVar6) &&
                     ((this->features).descriptor_indexing.
                      descriptorBindingUniformBufferUpdateAfterBind == 0)) {
                    return false;
                  }
                  mutable_counts.storage_image = 1;
                  break;
                case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
                  if ((bVar6) &&
                     ((this->features).descriptor_indexing.
                      descriptorBindingStorageBufferUpdateAfterBind == 0)) {
                    return false;
                  }
                  mutable_counts.sampled_image = 1;
                }
              }
              local_98 = _supported_flags->pBindings[uStack_b8].descriptorCount * list._4_4_ +
                         local_98;
              total_count = _supported_flags->pBindings[uStack_b8].descriptorCount * local_e8 +
                            total_count;
              counts.storage_image =
                   _supported_flags->pBindings[uStack_b8].descriptorCount *
                   mutable_counts.storage_image + counts.storage_image;
              counts.sampled_image =
                   _supported_flags->pBindings[uStack_b8].descriptorCount *
                   mutable_counts.sampled_image + counts.sampled_image;
            }
            else {
              if (1 < VVar1 + 0xc45e7f40) {
                return false;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_120,"VK_QCOM_image_processing",&local_121);
              sVar3 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,&local_120);
              std::__cxx11::string::~string((string *)&local_120);
              std::allocator<char>::~allocator((allocator<char> *)&local_121);
              if (sVar3 == 0) {
                return false;
              }
              mutable_counts.ssbo_dynamic = 0;
              mutable_counts.acceleration_structure = 0;
            }
            if (mutable_counts._28_8_ != 0) {
              *(uint32_t *)mutable_counts._28_8_ =
                   _supported_flags->pBindings[uStack_b8].descriptorCount +
                   *(int *)mutable_counts._28_8_;
            }
            flags._4_4_ = _supported_flags->pBindings[uStack_b8].descriptorCount + flags._4_4_;
          }
          if ((uVar2 & 2) == 0) {
            if ((this->features).maintenance7.maintenance7 == 0) {
              if ((this->props2).properties.limits.maxDescriptorSetUniformBuffersDynamic <
                  counts.input_attachment) {
                return false;
              }
              if ((this->props2).properties.limits.maxDescriptorSetStorageBuffersDynamic <
                  counts.sampler) {
                return false;
              }
            }
            else {
              if ((this->props).maintenance7.maxDescriptorSetTotalUniformBuffersDynamic <
                  counts.input_attachment) {
                return false;
              }
              if ((this->props).maintenance7.maxDescriptorSetTotalStorageBuffersDynamic <
                  counts.sampler) {
                return false;
              }
              if ((this->props).maintenance7.maxDescriptorSetTotalBuffersDynamic <
                  counts.input_attachment + counts.sampler) {
                return false;
              }
            }
            if ((this->props2).properties.limits.maxDescriptorSetUniformBuffers <
                counts.storage_image) {
              return false;
            }
            if ((this->props2).properties.limits.maxDescriptorSetStorageBuffers <
                counts.sampled_image) {
              return false;
            }
            if ((this->props2).properties.limits.maxDescriptorSetSampledImages < local_98) {
              return false;
            }
            if ((this->props2).properties.limits.maxDescriptorSetStorageImages < total_count) {
              return false;
            }
            if ((this->props2).properties.limits.maxDescriptorSetSamplers < counts.ubo) {
              return false;
            }
            if ((this->props2).properties.limits.maxDescriptorSetInputAttachments < counts.ssbo) {
              return false;
            }
            if ((this->props).acceleration_structure.maxDescriptorSetAccelerationStructures <
                counts.ubo_dynamic) {
              return false;
            }
          }
          else {
            if ((this->features).maintenance7.maintenance7 == 0) {
              if ((this->props).descriptor_indexing.
                  maxDescriptorSetUpdateAfterBindUniformBuffersDynamic < counts.input_attachment) {
                return false;
              }
              if ((this->props).descriptor_indexing.
                  maxDescriptorSetUpdateAfterBindStorageBuffersDynamic < counts.sampler) {
                return false;
              }
            }
            else {
              if ((this->props).maintenance7.
                  maxDescriptorSetUpdateAfterBindTotalUniformBuffersDynamic <
                  counts.input_attachment) {
                return false;
              }
              if ((this->props).maintenance7.
                  maxDescriptorSetUpdateAfterBindTotalStorageBuffersDynamic < counts.sampler) {
                return false;
              }
              if ((this->props).maintenance7.maxDescriptorSetUpdateAfterBindTotalBuffersDynamic <
                  counts.input_attachment + counts.sampler) {
                return false;
              }
            }
            if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffers <
                counts.storage_image) {
              return false;
            }
            if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers <
                counts.sampled_image) {
              return false;
            }
            if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindSampledImages <
                local_98) {
              return false;
            }
            if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers <
                total_count) {
              return false;
            }
            if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindSamplers <
                counts.ubo) {
              return false;
            }
            if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindInputAttachments <
                counts.ssbo) {
              return false;
            }
            if ((this->props).acceleration_structure.
                maxDescriptorSetUpdateAfterBindAccelerationStructures < counts.ubo_dynamic) {
              return false;
            }
          }
          if (((_supported_flags->flags & 1) == 0) ||
             (flags._4_4_ <= (this->props).push_descriptor.maxPushDescriptors)) {
            if (((local_21 & 1) == 0) ||
               ((this->query == (DeviceQueryInterface *)0x0 ||
                (uVar2 = (*this->query->_vptr_DeviceQueryInterface[3])(this->query,_supported_flags)
                , (uVar2 & 1) != 0)))) {
              this_local._7_1_ = pnext_chain_is_supported(this,_supported_flags->pNext);
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::descriptor_set_layout_is_supported(const VkDescriptorSetLayoutCreateInfo *info) const
{
	bool must_check_set_layout_before_accept = false;

	// Only allow flags we recognize and validate.
	constexpr VkDescriptorSetLayoutCreateFlags supported_flags =
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_UPDATE_AFTER_BIND_POOL_BIT |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_DESCRIPTOR_BUFFER_BIT_EXT |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_EMBEDDED_IMMUTABLE_SAMPLERS_BIT_EXT |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_INDIRECT_BINDABLE_BIT_NV |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_PER_STAGE_BIT_NV;

	if ((info->flags & ~supported_flags) != 0)
		return false;

	if (null_device)
		return true;

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR) != 0)
	{
		if (enabled_extensions.count(VK_KHR_PUSH_DESCRIPTOR_EXTENSION_NAME) == 0 && features.vk14.pushDescriptor == 0)
			return false;
	}

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_UPDATE_AFTER_BIND_POOL_BIT) != 0)
	{
		// There doesn't seem to be a specific feature bit for this flag, key it on extension being enabled.
		// For specific descriptor types, we check the individual features.
		if (enabled_extensions.count(VK_EXT_DESCRIPTOR_INDEXING_EXTENSION_NAME) == 0 && !features.vk12.descriptorIndexing)
			return false;
	}

	if ((info->flags & (VK_DESCRIPTOR_SET_LAYOUT_CREATE_EMBEDDED_IMMUTABLE_SAMPLERS_BIT_EXT |
	                    VK_DESCRIPTOR_SET_LAYOUT_CREATE_DESCRIPTOR_BUFFER_BIT_EXT)) != 0)
	{
		if (!features.descriptor_buffer.descriptorBuffer)
			return false;

		if (info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR)
		{
			if (!features.descriptor_buffer.descriptorBufferPushDescriptors)
				return false;
		}
	}

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_INDIRECT_BINDABLE_BIT_NV) != 0 &&
	    features.device_generated_commands_compute_nv.deviceGeneratedCompute == VK_FALSE)
		return false;

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PER_STAGE_BIT_NV) != 0 &&
	    features.per_stage_descriptor_set_nv.perStageDescriptorSet == VK_FALSE)
		return false;

	struct DescriptorCounts
	{
		uint32_t sampled_image;
		uint32_t storage_image;
		uint32_t ssbo;
		uint32_t ubo;
		uint32_t input_attachment;
		uint32_t sampler;
		uint32_t ubo_dynamic;
		uint32_t ssbo_dynamic;
		uint32_t acceleration_structure;
	};
	DescriptorCounts counts = {};
	uint32_t total_count = 0;

	auto *flags = find_pnext<VkDescriptorSetLayoutBindingFlagsCreateInfo>(
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO,
			info->pNext);

	auto *mutable_info = find_pnext<VkMutableDescriptorTypeCreateInfoEXT>(
			VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT,
			info->pNext);

	bool pool_is_update_after_bind = (info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_UPDATE_AFTER_BIND_POOL_BIT) != 0;

	for (unsigned i = 0; i < info->bindingCount; i++)
	{
		if (!shader_stage_mask_is_supported(info->pBindings[i].stageFlags))
			return false;

		constexpr VkDescriptorBindingFlags supported_binding_flags =
				VK_DESCRIPTOR_BINDING_UPDATE_AFTER_BIND_BIT |
				VK_DESCRIPTOR_BINDING_UPDATE_UNUSED_WHILE_PENDING_BIT |
				VK_DESCRIPTOR_BINDING_VARIABLE_DESCRIPTOR_COUNT_BIT |
				VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT;

		if (flags && (flags->pBindingFlags[i] & ~supported_binding_flags) != 0)
			return false;

		bool binding_is_update_after_bind =
				flags && i < flags->bindingCount &&
				(flags->pBindingFlags[i] & VK_DESCRIPTOR_BINDING_UPDATE_AFTER_BIND_BIT) != 0;

		uint32_t *count = nullptr;

		switch (info->pBindings[i].descriptorType)
		{
		case VK_DESCRIPTOR_TYPE_INLINE_UNIFORM_BLOCK_EXT:
			if (features.inline_uniform_block.inlineUniformBlock == VK_FALSE)
				return false;
			// TODO: maxInlineUniformTotalSize, but this shouldn't matter when we use the EXT.
			if (info->pBindings[i].descriptorCount > props.inline_uniform_block.maxInlineUniformBlockSize)
				return false;
			if (binding_is_update_after_bind && features.inline_uniform_block.descriptorBindingInlineUniformBlockUpdateAfterBind == VK_FALSE)
				return false;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.ssbo;
			break;

		case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.ubo;
			break;

		case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
		case VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.sampled_image;
			break;

		case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformTexelBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.sampled_image;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageTexelBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.storage_image;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageImageUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.storage_image;
			break;

		case VK_DESCRIPTOR_TYPE_SAMPLER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.sampler;
			break;

		case VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT:
			if (binding_is_update_after_bind)
				return false;
			count = &counts.input_attachment;
			break;

		case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC:
			if (binding_is_update_after_bind)
				return false;
			count = &counts.ubo_dynamic;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC:
			if (binding_is_update_after_bind)
				return false;
			count = &counts.ssbo_dynamic;
			break;

		case VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR:
			if (binding_is_update_after_bind &&
			    features.acceleration_structure.descriptorBindingAccelerationStructureUpdateAfterBind == VK_FALSE)
				return false;
			if (features.acceleration_structure.accelerationStructure == VK_FALSE)
				return false;
			count = &counts.acceleration_structure;
			break;

		case VK_DESCRIPTOR_TYPE_MUTABLE_EXT:
		{
			DescriptorCounts mutable_counts = {};
			if (features.mutable_descriptor_type.mutableDescriptorType == VK_FALSE)
				return false;
			if (!mutable_info || i >= mutable_info->mutableDescriptorTypeListCount)
				return false;

			auto &list = mutable_info->pMutableDescriptorTypeLists[i];

			for (uint32_t j = 0; j < list.descriptorTypeCount; j++)
			{
				switch (list.pDescriptorTypes[j])
				{
				case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.ssbo = 1;
					break;

				case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.ubo = 1;
					break;

				case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.sampled_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformTexelBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.sampled_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageImageUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.storage_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageTexelBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.storage_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_SAMPLER:
					// Sampler is a non-standard type for mutable
					mutable_counts.sampled_image = 1;
					must_check_set_layout_before_accept = true;
					break;

				default:
					return false;
				}
			}

			counts.sampled_image += info->pBindings[i].descriptorCount * mutable_counts.sampled_image;
			counts.storage_image += info->pBindings[i].descriptorCount * mutable_counts.storage_image;
			counts.ubo += info->pBindings[i].descriptorCount * mutable_counts.ubo;
			counts.ssbo += info->pBindings[i].descriptorCount * mutable_counts.ssbo;
			break;
		}

		case VK_DESCRIPTOR_TYPE_BLOCK_MATCH_IMAGE_QCOM:
		case VK_DESCRIPTOR_TYPE_SAMPLE_WEIGHT_IMAGE_QCOM:
			if (enabled_extensions.count(VK_QCOM_IMAGE_PROCESSING_EXTENSION_NAME) == 0)
				return false;
			// *shrug*
			count = nullptr;
			break;

		default:
			return false;
		}

		if (count)
			*count += info->pBindings[i].descriptorCount;
		total_count += info->pBindings[i].descriptorCount;
	}

	if (pool_is_update_after_bind)
	{
		if (features.maintenance7.maintenance7)
		{
			if (counts.ubo_dynamic > props.maintenance7.maxDescriptorSetUpdateAfterBindTotalUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props.maintenance7.maxDescriptorSetUpdateAfterBindTotalStorageBuffersDynamic)
				return false;
			if ((counts.ubo_dynamic + counts.ssbo_dynamic) > props.maintenance7.maxDescriptorSetUpdateAfterBindTotalBuffersDynamic)
				return false;
		}
		else
		{
			if (counts.ubo_dynamic > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffersDynamic)
				return false;
		}
		if (counts.ubo > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffers)
			return false;
		if (counts.ssbo > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers)
			return false;
		if (counts.sampled_image > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindSampledImages)
			return false;
		if (counts.storage_image > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers)
			return false;
		if (counts.sampler > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindSamplers)
			return false;
		if (counts.input_attachment > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindInputAttachments)
			return false;
		if (counts.acceleration_structure > props.acceleration_structure.maxDescriptorSetUpdateAfterBindAccelerationStructures)
			return false;
	}
	else
	{
		if (features.maintenance7.maintenance7)
		{
			if (counts.ubo_dynamic > props.maintenance7.maxDescriptorSetTotalUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props.maintenance7.maxDescriptorSetTotalStorageBuffersDynamic)
				return false;
			if ((counts.ubo_dynamic + counts.ssbo_dynamic) > props.maintenance7.maxDescriptorSetTotalBuffersDynamic)
				return false;
		}
		else
		{
			if (counts.ubo_dynamic > props2.properties.limits.maxDescriptorSetUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props2.properties.limits.maxDescriptorSetStorageBuffersDynamic)
				return false;
		}
		if (counts.ubo > props2.properties.limits.maxDescriptorSetUniformBuffers)
			return false;
		if (counts.ssbo > props2.properties.limits.maxDescriptorSetStorageBuffers)
			return false;
		if (counts.sampled_image > props2.properties.limits.maxDescriptorSetSampledImages)
			return false;
		if (counts.storage_image > props2.properties.limits.maxDescriptorSetStorageImages)
			return false;
		if (counts.sampler > props2.properties.limits.maxDescriptorSetSamplers)
			return false;
		if (counts.input_attachment > props2.properties.limits.maxDescriptorSetInputAttachments)
			return false;
		if (counts.acceleration_structure > props.acceleration_structure.maxDescriptorSetAccelerationStructures)
			return false;
	}

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR) != 0 &&
	    total_count > props.push_descriptor.maxPushDescriptors)
	{
		return false;
	}

	if (must_check_set_layout_before_accept)
	{
		if (query && !query->descriptor_set_layout_is_supported(info))
			return false;
	}

	return pnext_chain_is_supported(info->pNext);
}